

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.h
# Opt level: O0

cmCommand * __thiscall cmSourceGroupCommand::Clone(cmSourceGroupCommand *this)

{
  cmCommand *this_00;
  cmSourceGroupCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmSourceGroupCommand((cmSourceGroupCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmSourceGroupCommand; }